

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O1

CURLMcode curl_multi_wait(Curl_multi *multi,curl_waitfd *extra_fds,uint extra_nfds,int timeout_ms,
                         int *ret)

{
  ushort uVar1;
  int *piVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  undefined8 extraout_RDX;
  int iVar8;
  Curl_easy *pCVar9;
  int iVar10;
  ushort uVar11;
  uint nfds;
  pollfd *ppVar12;
  bool bVar13;
  bool bVar14;
  undefined1 auVar15 [16];
  curl_socket_t sockbunch [5];
  long timeout_internal;
  pollfd a_few_on_stack [10];
  uint local_b8 [8];
  int *local_98;
  long local_90;
  pollfd local_88 [11];
  
  uVar7 = (ulong)extra_nfds;
  if (multi == (Curl_multi *)0x0) {
    return CURLM_BAD_HANDLE;
  }
  if (multi->type != 0xbab1e) {
    return CURLM_BAD_HANDLE;
  }
  if (multi->in_callback != false) {
    return CURLM_RECURSIVE_API_CALL;
  }
  pCVar9 = multi->easyp;
  local_98 = ret;
  if (pCVar9 == (Curl_easy *)0x0) {
    iVar10 = 0;
  }
  else {
    iVar10 = 0;
    do {
      uVar3 = multi_getsock(pCVar9,(curl_socket_t *)local_b8,(int)uVar7);
      uVar5 = 0;
      do {
        if ((uVar3 >> ((uint)uVar5 & 0x1f) & 1) == 0) {
          uVar7 = 0xffffffff;
        }
        else {
          iVar10 = iVar10 + 1;
          uVar7 = (ulong)local_b8[uVar5];
        }
        if (((uVar3 >> ((byte)uVar5 & 0x1f)) >> 0x10 & 1) != 0) {
          iVar10 = iVar10 + 1;
          uVar7 = (ulong)local_b8[uVar5];
        }
      } while (((int)uVar7 != -1) && (uVar7 = uVar5 + 1, bVar13 = uVar5 < 4, uVar5 = uVar7, bVar13))
      ;
      pCVar9 = pCVar9->next;
    } while (pCVar9 != (Curl_easy *)0x0);
  }
  multi_timeout(multi,&local_90);
  iVar4 = timeout_ms;
  if (local_90 < timeout_ms) {
    iVar4 = (int)local_90;
  }
  if (local_90 < 0) {
    iVar4 = timeout_ms;
  }
  nfds = 0;
  uVar3 = iVar10 + extra_nfds;
  if (uVar3 == 0) {
    ppVar12 = (pollfd *)0x0;
  }
  else {
    if (10 < uVar3) {
      auVar15 = (undefined1  [16])(*Curl_cmalloc)((ulong)uVar3 << 3);
      if (auVar15._0_8_ == 0) {
        return CURLM_OUT_OF_MEMORY;
      }
      bVar13 = true;
      goto LAB_0012aa5b;
    }
    ppVar12 = local_88;
  }
  auVar15._8_8_ = extraout_RDX;
  auVar15._0_8_ = ppVar12;
  bVar13 = false;
LAB_0012aa5b:
  uVar7 = auVar15._8_8_;
  ppVar12 = auVar15._0_8_;
  if ((iVar10 != 0) && (pCVar9 = multi->easyp, pCVar9 != (Curl_easy *)0x0)) {
    uVar5 = 0;
    do {
      uVar3 = multi_getsock(pCVar9,(curl_socket_t *)local_b8,(int)uVar7);
      uVar6 = 0;
      do {
        if ((uVar3 >> ((uint)uVar6 & 0x1f) & 1) == 0) {
          uVar7 = 0xffffffff;
        }
        else {
          ppVar12[uVar5].fd = local_b8[uVar6];
          ppVar12[uVar5].events = 1;
          uVar5 = (ulong)((int)uVar5 + 1);
          uVar7 = (ulong)local_b8[uVar6];
        }
        if (((uVar3 >> ((byte)uVar6 & 0x1f)) >> 0x10 & 1) != 0) {
          ppVar12[uVar5].fd = local_b8[uVar6];
          ppVar12[uVar5].events = 4;
          uVar5 = (ulong)((int)uVar5 + 1);
          uVar7 = (ulong)local_b8[uVar6];
        }
        nfds = (uint)uVar5;
      } while (((int)uVar7 != -1) && (uVar7 = uVar6 + 1, bVar14 = uVar6 < 4, uVar6 = uVar7, bVar14))
      ;
      pCVar9 = pCVar9->next;
    } while (pCVar9 != (Curl_easy *)0x0);
  }
  piVar2 = local_98;
  if (extra_nfds != 0) {
    uVar7 = 0;
    do {
      uVar3 = nfds + (int)uVar7;
      ppVar12[uVar3].fd = extra_fds[uVar7].fd;
      ppVar12[uVar3].events = 0;
      uVar11 = extra_fds[uVar7].events & 1;
      ppVar12[uVar3].events = uVar11;
      uVar1 = extra_fds[uVar7].events;
      if ((uVar1 & 2) != 0) {
        ppVar12[uVar3].events = uVar11 | 2;
      }
      if ((uVar1 & 4) != 0) {
        *(byte *)&ppVar12[uVar3].events = (byte)ppVar12[uVar3].events | 4;
      }
      uVar7 = uVar7 + 1;
    } while (extra_nfds != uVar7);
    nfds = nfds + (int)uVar7;
  }
  iVar8 = 0;
  if (((nfds != 0) && (iVar4 = Curl_poll(ppVar12,nfds,iVar4), iVar8 = 0, 0 < iVar4)) &&
     (iVar8 = iVar4, extra_nfds != 0)) {
    uVar7 = 0;
    do {
      extra_fds[uVar7].revents = ppVar12[(uint)(iVar10 + (int)uVar7)].revents & 7;
      uVar7 = uVar7 + 1;
    } while (extra_nfds != uVar7);
  }
  if (bVar13) {
    (*Curl_cfree)(ppVar12);
  }
  if (piVar2 != (int *)0x0) {
    *piVar2 = iVar8;
  }
  return CURLM_OK;
}

Assistant:

CURLMcode curl_multi_wait(struct Curl_multi *multi,
                          struct curl_waitfd extra_fds[],
                          unsigned int extra_nfds,
                          int timeout_ms,
                          int *ret)
{
  struct Curl_easy *data;
  curl_socket_t sockbunch[MAX_SOCKSPEREASYHANDLE];
  int bitmap;
  unsigned int i;
  unsigned int nfds = 0;
  unsigned int curlfds;
  struct pollfd *ufds = NULL;
  bool ufds_malloc = FALSE;
  long timeout_internal;
  int retcode = 0;
  struct pollfd a_few_on_stack[NUM_POLLS_ON_STACK];

  if(!GOOD_MULTI_HANDLE(multi))
    return CURLM_BAD_HANDLE;

  if(multi->in_callback)
    return CURLM_RECURSIVE_API_CALL;

  /* Count up how many fds we have from the multi handle */
  data = multi->easyp;
  while(data) {
    bitmap = multi_getsock(data, sockbunch, MAX_SOCKSPEREASYHANDLE);

    for(i = 0; i< MAX_SOCKSPEREASYHANDLE; i++) {
      curl_socket_t s = CURL_SOCKET_BAD;

      if(bitmap & GETSOCK_READSOCK(i)) {
        ++nfds;
        s = sockbunch[i];
      }
      if(bitmap & GETSOCK_WRITESOCK(i)) {
        ++nfds;
        s = sockbunch[i];
      }
      if(s == CURL_SOCKET_BAD) {
        break;
      }
    }

    data = data->next; /* check next handle */
  }

  /* If the internally desired timeout is actually shorter than requested from
     the outside, then use the shorter time! But only if the internal timer
     is actually larger than -1! */
  (void)multi_timeout(multi, &timeout_internal);
  if((timeout_internal >= 0) && (timeout_internal < (long)timeout_ms))
    timeout_ms = (int)timeout_internal;

  curlfds = nfds; /* number of internal file descriptors */
  nfds += extra_nfds; /* add the externally provided ones */

  if(nfds) {
    if(nfds > NUM_POLLS_ON_STACK) {
      /* 'nfds' is a 32 bit value and 'struct pollfd' is typically 8 bytes
         big, so at 2^29 sockets this value might wrap. When a process gets
         the capability to actually handle over 500 million sockets this
         calculation needs a integer overflow check. */
      ufds = malloc(nfds * sizeof(struct pollfd));
      if(!ufds)
        return CURLM_OUT_OF_MEMORY;
      ufds_malloc = TRUE;
    }
    else
      ufds = &a_few_on_stack[0];
  }
  nfds = 0;

  /* only do the second loop if we found descriptors in the first stage run
     above */

  if(curlfds) {
    /* Add the curl handles to our pollfds first */
    data = multi->easyp;
    while(data) {
      bitmap = multi_getsock(data, sockbunch, MAX_SOCKSPEREASYHANDLE);

      for(i = 0; i< MAX_SOCKSPEREASYHANDLE; i++) {
        curl_socket_t s = CURL_SOCKET_BAD;

        if(bitmap & GETSOCK_READSOCK(i)) {
          ufds[nfds].fd = sockbunch[i];
          ufds[nfds].events = POLLIN;
          ++nfds;
          s = sockbunch[i];
        }
        if(bitmap & GETSOCK_WRITESOCK(i)) {
          ufds[nfds].fd = sockbunch[i];
          ufds[nfds].events = POLLOUT;
          ++nfds;
          s = sockbunch[i];
        }
        if(s == CURL_SOCKET_BAD) {
          break;
        }
      }

      data = data->next; /* check next handle */
    }
  }

  /* Add external file descriptions from poll-like struct curl_waitfd */
  for(i = 0; i < extra_nfds; i++) {
    ufds[nfds].fd = extra_fds[i].fd;
    ufds[nfds].events = 0;
    if(extra_fds[i].events & CURL_WAIT_POLLIN)
      ufds[nfds].events |= POLLIN;
    if(extra_fds[i].events & CURL_WAIT_POLLPRI)
      ufds[nfds].events |= POLLPRI;
    if(extra_fds[i].events & CURL_WAIT_POLLOUT)
      ufds[nfds].events |= POLLOUT;
    ++nfds;
  }

  if(nfds) {
    int pollrc;
    /* wait... */
    pollrc = Curl_poll(ufds, nfds, timeout_ms);

    if(pollrc > 0) {
      retcode = pollrc;
      /* copy revents results from the poll to the curl_multi_wait poll
         struct, the bit values of the actual underlying poll() implementation
         may not be the same as the ones in the public libcurl API! */
      for(i = 0; i < extra_nfds; i++) {
        unsigned short mask = 0;
        unsigned r = ufds[curlfds + i].revents;

        if(r & POLLIN)
          mask |= CURL_WAIT_POLLIN;
        if(r & POLLOUT)
          mask |= CURL_WAIT_POLLOUT;
        if(r & POLLPRI)
          mask |= CURL_WAIT_POLLPRI;

        extra_fds[i].revents = mask;
      }
    }
  }

  if(ufds_malloc)
    free(ufds);
  if(ret)
    *ret = retcode;
  return CURLM_OK;
}